

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O3

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>::
insert<std::basic_string_view<char,std::char_traits<char>>>
          (DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
           *this,size_t param_2,char *param_3,
          basic_string_view<char,_std::char_traits<char>_> *param_4)

{
  undefined8 uVar1;
  long lVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar3;
  optional<unsigned_long> oVar4;
  size_type index;
  _Storage<unsigned_long,_true> local_30;
  key_type local_28;
  
  local_28._M_len = param_2;
  local_28._M_str = param_3;
  local_30 = (_Storage<unsigned_long,_true>)
             std::
             _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(this + 0x18),&local_28);
  if ((__node_type *)local_30._M_value == (__node_type *)0x0) {
    local_30._M_value = (*(long *)(this + 8) - *(long *)this >> 3) * 0x2e8ba2e8ba2e8ba3;
    std::vector<helics::BasicBrokerInfo,std::allocator<helics::BasicBrokerInfo>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<helics::BasicBrokerInfo,std::allocator<helics::BasicBrokerInfo>> *)this,
               param_4);
    StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *)
               (this + 0x50),&local_28);
    if ((long)*(int *)(this + 0x68) == 0) {
      lVar2 = *(long *)(*(long *)(this + 0x58) + -8 + (*(ulong *)(this + 0x50) >> 5) * 8) + 0x3e0;
    }
    else {
      lVar2 = *(long *)(*(long *)(this + 0x58) + (long)*(int *)(this + 100) * 8) +
              (long)*(int *)(this + 0x68) * 0x20 + -0x20;
    }
    pVar3 = std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string&,unsigned_long&>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)(this + 0x18),lVar2,&local_30);
    uVar1 = CONCAT71(pVar3._9_7_,1);
  }
  else {
    uVar1 = 0;
  }
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar1;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_30._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            std::string_view searchValue1,
            no_search_type /*searchValue2*/,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                return std::nullopt;
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue1);
            lookup1.emplace(names.back(), index);
            return index;
        }